

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::FieldDescriptorProto::InternalSerializeWithCachedSizesToArray
          (FieldDescriptorProto *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  int iVar2;
  int32 iVar3;
  FieldDescriptorProto_Label value;
  FieldDescriptorProto_Type value_00;
  char *pcVar4;
  string *psVar5;
  UnknownFieldSet *unknown_fields;
  uint8 *puStack_40;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  FieldDescriptorProto *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  puStack_40 = target;
  if ((uVar1 & 1) != 0) {
    name_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FieldDescriptorProto.name");
    psVar5 = name_abi_cxx11_(this);
    puStack_40 = internal::WireFormatLite::WriteStringToArray(1,psVar5,target);
  }
  if ((uVar1 & 2) != 0) {
    extendee_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    extendee_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FieldDescriptorProto.extendee");
    psVar5 = extendee_abi_cxx11_(this);
    puStack_40 = internal::WireFormatLite::WriteStringToArray(2,psVar5,puStack_40);
  }
  if ((uVar1 & 0x40) != 0) {
    iVar3 = number(this);
    puStack_40 = internal::WireFormatLite::WriteInt32ToArray(3,iVar3,puStack_40);
  }
  if ((uVar1 & 0x100) != 0) {
    value = label(this);
    puStack_40 = internal::WireFormatLite::WriteEnumToArray(4,value,puStack_40);
  }
  if ((uVar1 & 0x200) != 0) {
    value_00 = type(this);
    puStack_40 = internal::WireFormatLite::WriteEnumToArray(5,value_00,puStack_40);
  }
  if ((uVar1 & 4) != 0) {
    type_name_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    type_name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FieldDescriptorProto.type_name");
    psVar5 = type_name_abi_cxx11_(this);
    puStack_40 = internal::WireFormatLite::WriteStringToArray(6,psVar5,puStack_40);
  }
  if ((uVar1 & 8) != 0) {
    default_value_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    default_value_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FieldDescriptorProto.default_value");
    psVar5 = default_value_abi_cxx11_(this);
    puStack_40 = internal::WireFormatLite::WriteStringToArray(7,psVar5,puStack_40);
  }
  if ((uVar1 & 0x20) != 0) {
    puStack_40 = internal::WireFormatLite::
                 InternalWriteMessageNoVirtualToArray<google::protobuf::FieldOptions>
                           (8,this->options_,deterministic,puStack_40);
  }
  if ((uVar1 & 0x80) != 0) {
    iVar3 = oneof_index(this);
    puStack_40 = internal::WireFormatLite::WriteInt32ToArray(9,iVar3,puStack_40);
  }
  if ((uVar1 & 0x10) != 0) {
    json_name_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    json_name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FieldDescriptorProto.json_name");
    psVar5 = json_name_abi_cxx11_(this);
    puStack_40 = internal::WireFormatLite::WriteStringToArray(10,psVar5,puStack_40);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = FieldDescriptorProto::unknown_fields(this);
    puStack_40 = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,puStack_40);
  }
  return puStack_40;
}

Assistant:

::google::protobuf::uint8* FieldDescriptorProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FieldDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string extendee = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->extendee().data(), this->extendee().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.extendee");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->extendee(), target);
  }

  // optional int32 number = 3;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->number(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      4, this->label(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      5, this->type(), target);
  }

  // optional string type_name = 6;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type_name().data(), this->type_name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.type_name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        6, this->type_name(), target);
  }

  // optional string default_value = 7;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->default_value().data(), this->default_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.default_value");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        7, this->default_value(), target);
  }

  // optional .google.protobuf.FieldOptions options = 8;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        8, *this->options_, deterministic, target);
  }

  // optional int32 oneof_index = 9;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(9, this->oneof_index(), target);
  }

  // optional string json_name = 10;
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->json_name().data(), this->json_name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.json_name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        10, this->json_name(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FieldDescriptorProto)
  return target;
}